

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O0

_Bool cf_hc_data_pending(Curl_cfilter *cf,Curl_easy *data)

{
  void *pvVar1;
  _Bool _Var2;
  _Bool local_29;
  cf_hc_ctx *ctx;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvVar1 = cf->ctx;
  if ((cf->field_0x24 & 1) == 0) {
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) &&
        (cf != (Curl_cfilter *)0x0)) && (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"data_pending");
    }
    _Var2 = cf_hc_baller_data_pending((cf_hc_baller *)((long)pvVar1 + 0x28),data);
    local_29 = true;
    if (!_Var2) {
      local_29 = cf_hc_baller_data_pending((cf_hc_baller *)((long)pvVar1 + 0x58),data);
    }
    cf_local._7_1_ = local_29;
  }
  else {
    cf_local._7_1_ = (*cf->next->cft->has_data_pending)(cf->next,data);
  }
  return cf_local._7_1_;
}

Assistant:

static bool cf_hc_data_pending(struct Curl_cfilter *cf,
                               const struct Curl_easy *data)
{
  struct cf_hc_ctx *ctx = cf->ctx;

  if(cf->connected)
    return cf->next->cft->has_data_pending(cf->next, data);

  CURL_TRC_CF((struct Curl_easy *)data, cf, "data_pending");
  return cf_hc_baller_data_pending(&ctx->h3_baller, data)
         || cf_hc_baller_data_pending(&ctx->h21_baller, data);
}